

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O0

void CompiledMixedType<char,char>(void)

{
  char u2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> su;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> st;
  bool b;
  char t;
  char u;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  char in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff71;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  undefined1 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff75;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff76;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff77;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff81;
  undefined1 in_stack_ffffffffffffff82;
  undefined1 in_stack_ffffffffffffff83;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff86;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffff87;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_5;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_4;
  byte local_3;
  char local_2;
  char local_1;
  
  local_1 = '\0';
  local_2 = 0;
  local_3 = 0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_4,&local_1);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt(&local_5,&local_1);
  local_3 = (local_3 ^ 0xff) & 1;
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (char *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,
                                                CONCAT14(in_stack_ffffffffffffff7c,
                                                         CONCAT13(in_stack_ffffffffffffff7b,
                                                                  CONCAT12(in_stack_ffffffffffffff7a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (char *)CONCAT17(in_stack_ffffffffffffff7f,
                              CONCAT16(in_stack_ffffffffffffff7e,
                                       CONCAT15(in_stack_ffffffffffffff7d,
                                                CONCAT14(in_stack_ffffffffffffff7c,
                                                         CONCAT13(in_stack_ffffffffffffff7b,
                                                                  CONCAT12(in_stack_ffffffffffffff7a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  local_4.m_int = local_5.m_int;
  SafeInt::operator_cast_to_char
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator*('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator*=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff87);
  local_1 = '\x01';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff87);
  local_1 = '\x01';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator/('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator/=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff87);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator+('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator+=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff87);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  local_1 = '\0';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator-('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator-=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff87);
  local_1 = '\x01';
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff87.m_int,
                      CONCAT16(in_stack_ffffffffffffff86.m_int,
                               CONCAT15(in_stack_ffffffffffffff85,
                                        CONCAT14(in_stack_ffffffffffffff84,
                                                 CONCAT13(in_stack_ffffffffffffff83,
                                                          CONCAT12(in_stack_ffffffffffffff82,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff81,
                                                  in_stack_ffffffffffffff80))))))),
             (int *)CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,
                                               CONCAT14(in_stack_ffffffffffffff7c,
                                                        CONCAT13(in_stack_ffffffffffffff7b,
                                                                 CONCAT12(in_stack_ffffffffffffff7a,
                                                                          CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff77.m_int);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator<<('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff77.m_int);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,
                               CONCAT15(in_stack_ffffffffffffff7d,
                                        CONCAT14(in_stack_ffffffffffffff7c,
                                                 CONCAT13(in_stack_ffffffffffffff7b,
                                                          CONCAT12(in_stack_ffffffffffffff7a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78))))))),
             in_stack_ffffffffffffff86);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator>>('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff76);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator&('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator&=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff76);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator|('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator|=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff76);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),'\0');
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  operator^('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT17(in_stack_ffffffffffffff77.m_int,
                                CONCAT16(in_stack_ffffffffffffff76.m_int,
                                         CONCAT15(in_stack_ffffffffffffff75,
                                                  CONCAT14(in_stack_ffffffffffffff74,
                                                           CONCAT13(in_stack_ffffffffffffff73,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff72,
                                                  CONCAT11(in_stack_ffffffffffffff71,
                                                           in_stack_ffffffffffffff70))))))));
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  SafeInt<char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff77.m_int,
                      CONCAT16(in_stack_ffffffffffffff76.m_int,
                               CONCAT15(in_stack_ffffffffffffff75,
                                        CONCAT14(in_stack_ffffffffffffff74,
                                                 CONCAT13(in_stack_ffffffffffffff73,
                                                          CONCAT12(in_stack_ffffffffffffff72,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff71,
                                                  in_stack_ffffffffffffff70))))))),
             in_stack_ffffffffffffff6f);
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator^=
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,
                               CONCAT15(in_stack_ffffffffffffff6d,
                                        CONCAT14(in_stack_ffffffffffffff6c,
                                                 CONCAT13(in_stack_ffffffffffffff6b,
                                                          CONCAT12(in_stack_ffffffffffffff6a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
             in_stack_ffffffffffffff77);
  local_3 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,'\0')
  ;
  local_3 = operator<('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0)
  ;
  local_3 = operator<((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,'\0'
                      );
  local_3 = operator<=('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0
                      );
  local_3 = operator<=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,'\0')
  ;
  local_3 = operator>('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0)
  ;
  local_3 = operator>((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                      (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,'\0'
                      );
  local_3 = operator>=('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0
                      );
  local_3 = operator>=((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
                       (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  local_3 = operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,'\0'
                      );
  local_3 = operator==('\0',(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0
                      );
  operator==((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0,
             (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x0);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}